

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_string.c
# Opt level: O2

int parseConvertElement(mpt_convertable *conv,mpt_type_t type,void *dest)

{
  ushort uVar1;
  _func_int_mpt_convertable_ptr_mpt_type_t_void_ptr **pp_Var2;
  ushort **ppuVar3;
  char *pcVar4;
  _mpt_vptr_convertable *p_Var5;
  char cVar6;
  mpt_convertable *sep;
  iovec *vec;
  _mpt_vptr_convertable *p_Var7;
  _mpt_vptr_convertable *local_30;
  size_t klen;
  
  p_Var5 = conv[4]._vptr;
  if (p_Var5 == (_mpt_vptr_convertable *)0x0) {
    return 0;
  }
  if (conv[6]._vptr != (_mpt_vptr_convertable *)0x0) {
    *(undefined1 *)&(conv[6]._vptr)->convert = *(undefined1 *)&conv[7]._vptr;
  }
  cVar6 = *(char *)&p_Var5->convert;
  if (cVar6 == '\0') {
    if (type != 0x73) {
      if (conv[6]._vptr != (_mpt_vptr_convertable *)0x0) {
        conv[6]._vptr = (_mpt_vptr_convertable *)0x0;
        return -0x10;
      }
      return -0x10;
    }
    if (dest != (void *)0x0) {
      *(undefined8 *)dest = 0;
    }
  }
  else {
    local_30 = p_Var5;
    if (type == 0x73) {
      ppuVar3 = __ctype_b_loc();
      while ((*(byte *)((long)*ppuVar3 + (long)cVar6 * 2 + 1) & 0x20) != 0) {
        cVar6 = *(char *)((long)&p_Var5->convert + 1);
        p_Var5 = (_mpt_vptr_convertable *)((long)&p_Var5->convert + 1);
      }
      if (dest != (void *)0x0) {
        *(_mpt_vptr_convertable **)dest = p_Var5;
      }
    }
    else {
      if (type == 0x6b) {
        sep = (mpt_convertable *)0x0;
        if (*(char *)&conv[8]._vptr != '\0') {
          sep = conv + 8;
        }
        pcVar4 = mpt_convert_key((char **)&local_30,(char *)sep,&klen);
        if (pcVar4 == (char *)0x0) {
          if (conv[6]._vptr != (_mpt_vptr_convertable *)0x0) {
            conv[6]._vptr = (_mpt_vptr_convertable *)0x0;
          }
          return -2;
        }
        if (dest != (void *)0x0) {
          *(char **)dest = pcVar4;
        }
        p_Var5 = conv[4]._vptr;
        local_30._0_4_ = (int)local_30 - (int)p_Var5;
      }
      else {
        if (type == 0x43) {
          ppuVar3 = __ctype_b_loc();
          p_Var7 = p_Var5;
          while (uVar1 = (*ppuVar3)[cVar6], (uVar1 >> 0xd & 1) != 0) {
            cVar6 = *(char *)((long)&p_Var7->convert + 1);
            p_Var7 = (_mpt_vptr_convertable *)((long)&p_Var7->convert + 1);
            p_Var5 = (_mpt_vptr_convertable *)((long)&p_Var5->convert + 1);
          }
          while ((uVar1 >> 0xd & 1) == 0) {
            pp_Var2 = &p_Var7->convert;
            p_Var7 = (_mpt_vptr_convertable *)((long)&p_Var7->convert + 1);
            p_Var5 = (_mpt_vptr_convertable *)((long)&p_Var5->convert + 1);
            uVar1 = (*ppuVar3)[*(char *)((long)pp_Var2 + 1)];
          }
          conv[6]._vptr = p_Var7;
          *(undefined1 *)&conv[7]._vptr = *(undefined1 *)&p_Var7->convert;
          *(undefined1 *)&p_Var7->convert = 0;
          if (dest != (void *)0x0) {
            p_Var7 = conv[4]._vptr;
            *(_mpt_vptr_convertable **)dest = p_Var7;
            *(long *)((long)dest + 8) = (long)p_Var5 - (long)p_Var7;
            return 0x73;
          }
          return 0x73;
        }
        local_30._0_4_ = mpt_convert_string((char *)conv[4]._vptr,type,dest);
        if ((int)local_30 < 0) {
          return (int)local_30;
        }
        p_Var5 = conv[4]._vptr;
      }
      p_Var5 = (_mpt_vptr_convertable *)((long)&p_Var5->convert + (long)(int)local_30);
      conv[6]._vptr = p_Var5;
      if (p_Var5 < conv[5]._vptr) {
        *(undefined1 *)&conv[7]._vptr = *(undefined1 *)&p_Var5->convert;
        *(undefined1 *)&p_Var5->convert = 0;
        return 0x73;
      }
    }
  }
  conv[6]._vptr = (_mpt_vptr_convertable *)0x0;
  return 0x73;
}

Assistant:

static int parseConvertElement(MPT_INTERFACE(convertable) *conv, MPT_TYPE(type) type, void *dest)
{
	MPT_STRUCT(parseIterator) *it = MPT_baseaddr(parseIterator, conv, elem._conv);
	const char *txt;
	int len;
	
	/* indicate consumed value */
	if (!(txt = it->val)) {
		return 0;
	}
	/* reset value end indicator */
	if (it->restore) {
		*it->restore = it->save;
	}
	if (!*txt) {
		if (type == 's') {
			if (dest) ((char **) dest)[0] = 0;
			it->restore = 0;
			return 's';
		}
		if (it->restore) {
			it->restore = 0;
		}
		return MPT_ERROR(MissingData);
	}
	/* return full remaining data */
	if (type == 's') {
		while (isspace(*txt)) ++txt;
		if (dest) *((const char **) dest) = txt;
		it->restore = 0;
		return 's';
	}
	if (type == MPT_type_toVector('c')) {
		while (isspace(*txt)) ++txt;
		while (!isspace(*txt)) ++txt;
		it->restore = (char *) txt;
		it->save = *txt;
		*it->restore = 0;
		if (dest) {
			struct iovec *vec = dest;
			vec->iov_base = it->val;
			vec->iov_len = txt - it->val;
		}
		return 's';
	}
	/* consume next complete word */
	if (type == 'k') {
		const char *sep = (char *) (it + 1);
		const char *key;
		size_t klen;
		if (!(key = mpt_convert_key(&txt, *sep ? sep : 0, &klen))) {
			if (it->restore) {
				it->restore = 0;
			}
			return MPT_ERROR(BadValue);
		}
		if (dest) {
			((const char **) dest)[0] = key;
		}
		len = txt - it->val;
	}
	/* convert to target type */
	else if ((len = mpt_convert_string(it->val, type, dest)) < 0) {
		return len;
	}
	/* terminate consumed substring */
	it->restore = it->val + len;
	if (it->restore >= it->end) {
		it->restore = 0;
	} else {
		it->save = *it->restore;
		*it->restore = 0;
	}
	return 's';
}